

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O1

Signedness __thiscall
spvtools::opt::anon_unknown_15::IsGreaterThanZero::VisitExpr
          (IsGreaterThanZero *this,SENode *node,
          function<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness)>
          *reduce)

{
  pointer ppSVar1;
  Signedness SVar2;
  Signedness SVar3;
  undefined8 in_RAX;
  pointer ppSVar4;
  bool bVar5;
  undefined8 local_38;
  
  local_38 = in_RAX;
  SVar2 = Visit(this,*(node->children_).
                      super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  ppSVar4 = (node->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (node->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    ppSVar4 = ppSVar4 + 1;
    if (ppSVar4 == ppSVar1) {
      return SVar2;
    }
    SVar3 = kPositiveOrNegative;
    if (SVar2 != kPositiveOrNegative) {
      SVar3 = Visit(this,*ppSVar4);
      local_38 = CONCAT44(SVar2,SVar3);
      if ((reduce->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      SVar3 = (*reduce->_M_invoker)
                        ((_Any_data *)reduce,(Signedness *)((long)&local_38 + 4),
                         (Signedness *)&local_38);
    }
    bVar5 = SVar2 != kPositiveOrNegative;
    SVar2 = SVar3;
  } while (bVar5);
  return kPositiveOrNegative;
}

Assistant:

Signedness VisitExpr(
      const SENode* node,
      std::function<Signedness(Signedness, Signedness)> reduce) {
    Signedness result = Visit(*node->begin());
    for (const SENode* operand : make_range(++node->begin(), node->end())) {
      if (result == Signedness::kPositiveOrNegative) {
        return Signedness::kPositiveOrNegative;
      }
      result = reduce(result, Visit(operand));
    }
    return result;
  }